

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

_Bool tbl_MoveDeskToDesk(int sourceIdx,int targetIdx)

{
  SolStack_t *stackPtr;
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  ECardFace_t *pEVar5;
  ulong uVar6;
  Card_t card;
  Card_t helpCard;
  SolStack_t helpStack;
  
  stackPtr = DeskStacks + sourceIdx;
  pEVar5 = &DeskStacks[sourceIdx].m_cards[0].m_face;
  uVar6 = 0;
  do {
    uVar2 = stackPtr->m_size;
    if (uVar2 <= uVar6) goto LAB_00101d25;
    if (*pEVar5 == CF_UP) {
      uVar1 = ((Card_t *)(pEVar5 + -2))->m_type;
      uVar3 = ((Card_t *)(pEVar5 + -2))->m_color;
      card.m_color = uVar3;
      card.m_type = uVar1;
      card.m_face = CF_UP;
      _Var4 = IsCardMovableToDesk(card,DeskStacks + targetIdx);
      if (_Var4) {
        stk_InitEmpty(&helpStack);
        while (uVar6 < stackPtr->m_size) {
          _Var4 = stk_Pop(stackPtr,&helpCard);
          if (_Var4) {
            stk_PushCopy(&helpStack,helpCard);
          }
        }
        while( true ) {
          _Var4 = stk_Pop(&helpStack,&helpCard);
          if (!_Var4) break;
          stk_PushCopy(DeskStacks + targetIdx,helpCard);
        }
        stk_TurnTopCardUp(stackPtr);
LAB_00101d25:
        return uVar6 < uVar2;
      }
    }
    uVar6 = uVar6 + 1;
    pEVar5 = pEVar5 + 3;
  } while( true );
}

Assistant:

bool tbl_MoveDeskToDesk(int sourceIdx, int targetIdx)
{
  SolStack_t* srcStackPtr = &DeskStacks[sourceIdx];
  SolStack_t* targetPtr = &DeskStacks[targetIdx];
  SolStack_t helpStack;
  Card_t helpCard;
  Card_t* srcCardPtr = NULL;
  int srcCardIdx;

  // try to find card facing up in the source column that would fit on target
  // card or empty slot
  for (srcCardIdx = 0; srcCardIdx < srcStackPtr->m_size; srcCardIdx++) {
    srcCardPtr = &srcStackPtr->m_cards[srcCardIdx];
    if (srcCardPtr->m_face == CF_UP &&
        IsCardMovableToDesk(*srcCardPtr, targetPtr)) {
      break; // got it
    }
    srcCardPtr = NULL;
  }

  if (!srcCardPtr) {
    return false;
  }

  // move cards from one stack to the other
  stk_InitEmpty(&helpStack);

  while (srcCardIdx < srcStackPtr->m_size) {
    if (stk_Pop(srcStackPtr, &helpCard)) {
      stk_PushCopy(&helpStack, helpCard);
    }
  }

  while (stk_Pop(&helpStack, &helpCard)) {
    stk_PushCopy(targetPtr, helpCard);
  }

  stk_TurnTopCardUp(srcStackPtr);

  return true;
}